

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

bool cfd::core::Privkey::HasWif(string *wif,NetType *net_type,bool *is_compressed)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  uint32_t prefix;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  ByteData data;
  size_t is_uncompressed;
  uint local_7c;
  CfdSourceLocation local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ByteData local_48;
  size_t local_30;
  
  local_30 = 0;
  iVar2 = wally_wif_is_uncompressed((wif->_M_dataplus)._M_p,&local_30);
  if (iVar2 != 0) {
    return false;
  }
  CryptoUtil::DecodeBase58Check(&local_48,(string *)wif);
  sVar3 = ByteData::GetDataSize(&local_48);
  if (0x20 >= sVar3) goto LAB_003642b3;
  ByteData::GetBytes(&local_60,&local_48);
  local_7c = (uint)*local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  if (net_type != (NetType *)0x0) {
    GetKeyFormatList();
    if (local_78.filename == (char *)CONCAT44(local_78._12_4_,local_78.line)) {
      ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                 &local_78);
    }
    else {
      bVar5 = false;
      pcVar1 = local_78.filename;
      do {
        pcVar4 = pcVar1 + 0x78;
        if (local_7c == (byte)pcVar1[0x31]) {
          *net_type = (byte)pcVar1[0x30] ^ kTestnet;
          bVar5 = true;
          break;
        }
        pcVar1 = pcVar4;
      } while (pcVar4 != (char *)CONCAT44(local_78._12_4_,local_78.line));
      ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                 &local_78);
      if (bVar5) goto LAB_0036428d;
    }
    local_78.filename = "cfdcore_key.cpp";
    local_78.line = 0x31c;
    local_78.funcname = "HasWif";
    logger::log<unsigned_int&>
              (&local_78,kCfdLogLevelWarning,"Invalid Privkey format. prefix={}",&local_7c);
    *net_type = kTestnet;
  }
LAB_0036428d:
  if (is_compressed != (bool *)0x0) {
    *is_compressed = local_30 == 0;
  }
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_003642b3:
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0x20 < sVar3;
}

Assistant:

bool Privkey::HasWif(
    const std::string &wif, NetType *net_type, bool *is_compressed) {
  static constexpr size_t kWifMinimumSize = EC_PRIVATE_KEY_LEN + 1;

  size_t is_uncompressed = 0;
  int ret = wally_wif_is_uncompressed(wif.c_str(), &is_uncompressed);
  if (ret != WALLY_OK) {
    // contains check wif.
    return false;
  }

  bool has_wif = false;
  ByteData data = CryptoUtil::DecodeBase58Check(wif);
  if (data.GetDataSize() >= kWifMinimumSize) {
    std::vector<uint8_t> key_data = data.GetBytes();
    uint32_t prefix = key_data[0];

    if (net_type != nullptr) {
      bool has_prefix = false;
      for (const auto &format : GetKeyFormatList()) {
        if (format.GetWifPrefix() == prefix) {
          *net_type = format.GetNetType();
          has_prefix = true;
          break;
        }
      }
      if (!has_prefix) {
        warn(CFD_LOG_SOURCE, "Invalid Privkey format. prefix={}", prefix);
        *net_type = NetType::kTestnet;
      }
    }

    if (is_compressed != nullptr) {
      *is_compressed = (is_uncompressed == 0) ? true : false;
    }
    has_wif = true;
  }
  return has_wif;
}